

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_as_json_int32(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  long *plVar4;
  long *unaff_R14;
  long *unaff_R15;
  size_t len;
  undefined1 auStack_70 [8];
  undefined8 uStack_68;
  long *plStack_60;
  code *pcStack_58;
  long lStack_48;
  undefined8 uStack_40;
  long *plStack_38;
  code *pcStack_30;
  long local_20;
  
  pcStack_30 = (code *)0x12cf90;
  uVar3 = bson_new();
  pcStack_30 = (code *)0x12cfac;
  cVar1 = bson_append_int32(uVar3,"foo",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_30 = (code *)0x12cffb;
    test_bson_as_json_int32_cold_1();
LAB_0012cffb:
    pcStack_30 = (code *)0x12d000;
    test_bson_as_json_int32_cold_2();
  }
  else {
    unaff_R15 = &local_20;
    pcStack_30 = (code *)0x12cfc0;
    plVar4 = (long *)bson_as_json(uVar3,unaff_R15);
    if (local_20 != 0x10) goto LAB_0012cffb;
    pcStack_30 = (code *)0x12cfd8;
    iVar2 = strcmp("{ \"foo\" : 1234 }",(char *)plVar4);
    unaff_R14 = plVar4;
    if (iVar2 == 0) {
      pcStack_30 = (code *)0x12cfe4;
      bson_free(plVar4);
      pcStack_30 = (code *)0x12cfec;
      bson_destroy(uVar3);
      return;
    }
  }
  pcStack_30 = test_bson_as_json_int64;
  test_bson_as_json_int32_cold_3();
  pcStack_58 = (code *)0x12d013;
  uStack_40 = uVar3;
  plStack_38 = unaff_R14;
  pcStack_30 = (code *)unaff_R15;
  uVar3 = bson_new();
  pcStack_58 = (code *)0x12d034;
  cVar1 = bson_append_int64(uVar3,"foo",0xffffffff,0x4bc4ea0973c01f2);
  if (cVar1 == '\0') {
    pcStack_58 = (code *)0x12d083;
    test_bson_as_json_int64_cold_1();
LAB_0012d083:
    pcStack_58 = (code *)0x12d088;
    test_bson_as_json_int64_cold_2();
  }
  else {
    unaff_R15 = &lStack_48;
    pcStack_58 = (code *)0x12d048;
    plVar4 = (long *)bson_as_json(uVar3,unaff_R15);
    if (lStack_48 != 0x1e) goto LAB_0012d083;
    pcStack_58 = (code *)0x12d060;
    iVar2 = strcmp("{ \"foo\" : 341234123412341234 }",(char *)plVar4);
    unaff_R14 = plVar4;
    if (iVar2 == 0) {
      pcStack_58 = (code *)0x12d06c;
      bson_free(plVar4);
      pcStack_58 = (code *)0x12d074;
      bson_destroy(uVar3);
      return;
    }
  }
  pcStack_58 = test_bson_as_json_double;
  test_bson_as_json_int64_cold_3();
  uStack_68 = uVar3;
  plStack_60 = unaff_R14;
  pcStack_58 = (code *)unaff_R15;
  uVar3 = bson_new();
  cVar1 = bson_append_double(0x405ee00000000000,uVar3,"foo",0xffffffff);
  if (cVar1 == '\0') {
    test_bson_as_json_double_cold_1();
LAB_0012d1b2:
    test_bson_as_json_double_cold_2();
LAB_0012d1b7:
    test_bson_as_json_double_cold_3();
LAB_0012d1bc:
    test_bson_as_json_double_cold_4();
  }
  else {
    cVar1 = bson_append_double(0x4008000000000000,uVar3,"bar",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d1b2;
    cVar1 = bson_append_double(0xbff0000000000000,uVar3,"baz",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d1b7;
    cVar1 = bson_append_double(0x3fa0000000000000,uVar3,"quux",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d1bc;
    cVar1 = bson_append_double(0x547d42aea2879f2e,uVar3,"huge",0xffffffff);
    if (cVar1 != '\0') {
      unaff_R14 = (long *)bson_as_json(uVar3,auStack_70);
      unaff_R15 = (long *)bson_strdup_printf(0x547d42aea2879f2e,
                                             "{ \"foo\" : 123.5, \"bar\" : 3.0, \"baz\" : -1.0, \"quux\" : 0.03125, \"huge\" : %.20g }"
                                            );
      if (unaff_R14 == unaff_R15) {
LAB_0012d18b:
        bson_free(unaff_R15);
        bson_free(unaff_R14);
        bson_destroy(uVar3);
        return;
      }
      iVar2 = strcmp((char *)unaff_R14,(char *)unaff_R15);
      if (iVar2 == 0) goto LAB_0012d18b;
      goto LAB_0012d1c6;
    }
  }
  test_bson_as_json_double_cold_5();
LAB_0012d1c6:
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",unaff_R14,unaff_R15);
  abort();
}

Assistant:

static void
test_bson_as_json_int32 (void)
{
   size_t len;
   bson_t *b;
   char *str;

   b = bson_new ();
   BSON_ASSERT (bson_append_int32 (b, "foo", -1, 1234));
   str = bson_as_json (b, &len);
   BSON_ASSERT (len == 16);
   BSON_ASSERT (!strcmp ("{ \"foo\" : 1234 }", str));
   bson_free (str);
   bson_destroy (b);
}